

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_inter_pred_luma_copy_w16out_ssse3
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  UWORD8 *pUVar1;
  long lVar2;
  WORD16 *pWVar3;
  int iVar4;
  undefined1 in_XMM0 [16];
  undefined1 auVar5 [16];
  
  if ((wd & 1U) != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x5e8,
                  "void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((ht & 1U) != 0) {
    __assert_fail("(ht % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x5e9,
                  "void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if ((wd & 6U) == 0) {
    if (0 < ht) {
      pWVar3 = pi2_dst + dst_strd;
      pUVar1 = pu1_src + src_strd;
      iVar4 = 0;
      do {
        if (0 < wd) {
          lVar2 = 0;
          do {
            auVar5 = pmovzxbw(in_XMM0,*(undefined8 *)(pu1_src + lVar2));
            auVar5 = psllw(auVar5,6);
            *(undefined1 (*) [16])(pi2_dst + lVar2) = auVar5;
            auVar5 = pmovzxbw(auVar5,*(undefined8 *)(pUVar1 + lVar2));
            in_XMM0 = psllw(auVar5,6);
            *(undefined1 (*) [16])(pWVar3 + lVar2) = in_XMM0;
            lVar2 = lVar2 + 8;
          } while ((int)lVar2 < wd);
        }
        pu1_src = pu1_src + src_strd * 2;
        iVar4 = iVar4 + 2;
        pWVar3 = pWVar3 + dst_strd * 2;
        pUVar1 = pUVar1 + src_strd * 2;
        pi2_dst = pi2_dst + dst_strd * 2;
      } while (iVar4 < ht);
    }
  }
  else if (0 < ht) {
    pWVar3 = pi2_dst + dst_strd;
    pUVar1 = pu1_src + src_strd;
    iVar4 = 0;
    do {
      if (0 < wd) {
        lVar2 = 0;
        do {
          auVar5 = pmovzxbw(in_XMM0,*(undefined8 *)(pu1_src + lVar2));
          auVar5 = psllw(auVar5,6);
          *(long *)(pi2_dst + lVar2) = auVar5._0_8_;
          auVar5 = pmovzxbw(auVar5,*(undefined8 *)(pUVar1 + lVar2));
          in_XMM0 = psllw(auVar5,6);
          *(long *)(pWVar3 + lVar2) = in_XMM0._0_8_;
          lVar2 = lVar2 + 4;
        } while ((int)lVar2 < wd);
      }
      pu1_src = pu1_src + src_strd * 2;
      iVar4 = iVar4 + 2;
      pWVar3 = pWVar3 + dst_strd * 2;
      pUVar1 = pUVar1 + src_strd * 2;
      pi2_dst = pi2_dst + dst_strd * 2;
    } while (iVar4 < ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *pu1_src,
                                             WORD16 *pi2_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    __m128i  s3, zero_8x16b;

    ASSERT(wd % 2 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/
    UNUSED(pi1_coeff);
    zero_8x16b = _mm_setzero_si128();
/*  outer for loop starts from here */
    if(wd % 8 == 0) /* wd = multiple of 8 case */
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < wd; col += 8)
            {
/* row =0 */
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_store_si128((__m128i *)(pi2_dst + offset), s3);

/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_store_si128((__m128i *)(pi2_dst + dst_strd + offset), s3);

                offset += 8; /* To pointer update */
            } /* inner for loop ends here(8-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer update */
            pi2_dst += 2 * dst_strd; /* pointer update */
        }
    }
    else /* wd = multiple of 4 case */
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < wd; col += 4)
            {
/* row =0 */
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_storel_epi64((__m128i *)(pi2_dst + offset), s3);

/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_storel_epi64((__m128i *)(pi2_dst + dst_strd + offset), s3);
                offset += 4; /* To pointer update */
            } /* inner for loop ends here(4-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer update */
            pi2_dst += 2 * dst_strd; /* pointer update */
        }
    }

}